

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  byte bVar38;
  int iVar39;
  ulong *puVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  ulong *puVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  int unaff_R14D;
  ulong *puVar49;
  ulong uVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  uint uVar56;
  float fVar57;
  uint uVar58;
  float fVar59;
  uint uVar60;
  vint4 bi;
  float fVar61;
  uint uVar62;
  float fVar63;
  uint uVar64;
  uint uVar65;
  float fVar66;
  float fVar67;
  uint uVar68;
  uint uVar69;
  float fVar70;
  float fVar71;
  uint uVar72;
  uint uVar73;
  float fVar74;
  vint4 ai;
  float fVar75;
  uint uVar76;
  uint uVar77;
  float fVar78;
  uint uVar79;
  float fVar80;
  float fVar81;
  uint uVar82;
  float fVar83;
  float fVar84;
  uint uVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  vint4 ai_1;
  uint uVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  NodeRef stack [244];
  byte local_8a8;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  size_t local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = root.ptr;
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar10 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar11 = (tray->tnear).field_0.i[k];
  iVar12 = (tray->tfar).field_0.i[k];
  puVar49 = local_7d0;
LAB_006e9a1b:
  do {
    puVar44 = puVar49;
    puVar40 = &local_7d8;
    if (puVar44 == puVar40) {
LAB_006e9e63:
      return puVar44 != &local_7d8;
    }
    puVar49 = puVar44 + -1;
    uVar47 = puVar44[-1];
    while ((uVar47 & 8) == 0) {
      pfVar1 = (float *)(uVar47 + 0x20 + uVar42);
      fVar55 = (*pfVar1 - fVar5) * fVar8;
      fVar57 = (pfVar1[1] - fVar5) * fVar8;
      fVar59 = (pfVar1[2] - fVar5) * fVar8;
      fVar61 = (pfVar1[3] - fVar5) * fVar8;
      pfVar1 = (float *)(uVar47 + 0x20 + uVar45);
      fVar63 = (*pfVar1 - fVar6) * fVar9;
      fVar67 = (pfVar1[1] - fVar6) * fVar9;
      fVar71 = (pfVar1[2] - fVar6) * fVar9;
      fVar75 = (pfVar1[3] - fVar6) * fVar9;
      uVar64 = (uint)((int)fVar63 < (int)fVar55) * (int)fVar55 |
               (uint)((int)fVar63 >= (int)fVar55) * (int)fVar63;
      uVar68 = (uint)((int)fVar67 < (int)fVar57) * (int)fVar57 |
               (uint)((int)fVar67 >= (int)fVar57) * (int)fVar67;
      uVar72 = (uint)((int)fVar71 < (int)fVar59) * (int)fVar59 |
               (uint)((int)fVar71 >= (int)fVar59) * (int)fVar71;
      uVar76 = (uint)((int)fVar75 < (int)fVar61) * (int)fVar61 |
               (uint)((int)fVar75 >= (int)fVar61) * (int)fVar75;
      pfVar1 = (float *)(uVar47 + 0x20 + uVar46);
      fVar55 = (*pfVar1 - fVar7) * fVar10;
      fVar57 = (pfVar1[1] - fVar7) * fVar10;
      fVar59 = (pfVar1[2] - fVar7) * fVar10;
      fVar61 = (pfVar1[3] - fVar7) * fVar10;
      uVar56 = (uint)((int)fVar55 < iVar11) * iVar11 | (uint)((int)fVar55 >= iVar11) * (int)fVar55;
      uVar58 = (uint)((int)fVar57 < iVar11) * iVar11 | (uint)((int)fVar57 >= iVar11) * (int)fVar57;
      uVar60 = (uint)((int)fVar59 < iVar11) * iVar11 | (uint)((int)fVar59 >= iVar11) * (int)fVar59;
      uVar62 = (uint)((int)fVar61 < iVar11) * iVar11 | (uint)((int)fVar61 >= iVar11) * (int)fVar61;
      pfVar1 = (float *)(uVar47 + 0x20 + (uVar42 ^ 0x10));
      fVar55 = (*pfVar1 - fVar5) * fVar8;
      fVar57 = (pfVar1[1] - fVar5) * fVar8;
      fVar59 = (pfVar1[2] - fVar5) * fVar8;
      fVar61 = (pfVar1[3] - fVar5) * fVar8;
      pfVar1 = (float *)(uVar47 + 0x20 + (uVar45 ^ 0x10));
      fVar63 = (*pfVar1 - fVar6) * fVar9;
      fVar67 = (pfVar1[1] - fVar6) * fVar9;
      fVar71 = (pfVar1[2] - fVar6) * fVar9;
      fVar75 = (pfVar1[3] - fVar6) * fVar9;
      uVar79 = (uint)((int)fVar55 < (int)fVar63) * (int)fVar55 |
               (uint)((int)fVar55 >= (int)fVar63) * (int)fVar63;
      uVar82 = (uint)((int)fVar57 < (int)fVar67) * (int)fVar57 |
               (uint)((int)fVar57 >= (int)fVar67) * (int)fVar67;
      uVar85 = (uint)((int)fVar59 < (int)fVar71) * (int)fVar59 |
               (uint)((int)fVar59 >= (int)fVar71) * (int)fVar71;
      uVar89 = (uint)((int)fVar61 < (int)fVar75) * (int)fVar61 |
               (uint)((int)fVar61 >= (int)fVar75) * (int)fVar75;
      pfVar1 = (float *)(uVar47 + 0x20 + (uVar46 ^ 0x10));
      fVar55 = (*pfVar1 - fVar7) * fVar10;
      fVar57 = (pfVar1[1] - fVar7) * fVar10;
      fVar59 = (pfVar1[2] - fVar7) * fVar10;
      fVar61 = (pfVar1[3] - fVar7) * fVar10;
      uVar65 = (uint)(iVar12 < (int)fVar55) * iVar12 | (uint)(iVar12 >= (int)fVar55) * (int)fVar55;
      uVar69 = (uint)(iVar12 < (int)fVar57) * iVar12 | (uint)(iVar12 >= (int)fVar57) * (int)fVar57;
      uVar73 = (uint)(iVar12 < (int)fVar59) * iVar12 | (uint)(iVar12 >= (int)fVar59) * (int)fVar59;
      uVar77 = (uint)(iVar12 < (int)fVar61) * iVar12 | (uint)(iVar12 >= (int)fVar61) * (int)fVar61;
      auVar14._4_4_ =
           -(uint)((int)(((int)uVar82 < (int)uVar69) * uVar82 |
                        ((int)uVar82 >= (int)uVar69) * uVar69) <
                  (int)(((int)uVar58 < (int)uVar68) * uVar68 | ((int)uVar58 >= (int)uVar68) * uVar58
                       ));
      auVar14._0_4_ =
           -(uint)((int)(((int)uVar79 < (int)uVar65) * uVar79 |
                        ((int)uVar79 >= (int)uVar65) * uVar65) <
                  (int)(((int)uVar56 < (int)uVar64) * uVar64 | ((int)uVar56 >= (int)uVar64) * uVar56
                       ));
      auVar14._8_4_ =
           -(uint)((int)(((int)uVar85 < (int)uVar73) * uVar85 |
                        ((int)uVar85 >= (int)uVar73) * uVar73) <
                  (int)(((int)uVar60 < (int)uVar72) * uVar72 | ((int)uVar60 >= (int)uVar72) * uVar60
                       ));
      auVar14._12_4_ =
           -(uint)((int)(((int)uVar89 < (int)uVar77) * uVar89 |
                        ((int)uVar89 >= (int)uVar77) * uVar77) <
                  (int)(((int)uVar62 < (int)uVar76) * uVar76 | ((int)uVar62 >= (int)uVar76) * uVar62
                       ));
      iVar39 = movmskps((int)puVar40,auVar14);
      if (iVar39 == 0xf) goto LAB_006e9a1b;
      bVar38 = (byte)iVar39 ^ 0xf;
      puVar40 = (ulong *)(uVar47 & 0xfffffffffffffff0);
      lVar43 = 0;
      if (bVar38 != 0) {
        for (; (bVar38 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
        }
      }
      uVar47 = puVar40[lVar43];
      uVar56 = bVar38 - 1 & (uint)bVar38;
      uVar48 = (ulong)uVar56;
      if (uVar56 != 0) {
        do {
          *puVar49 = uVar47;
          puVar49 = puVar49 + 1;
          lVar43 = 0;
          if (uVar48 != 0) {
            for (; (uVar48 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
            }
          }
          uVar47 = puVar40[lVar43];
          uVar48 = uVar48 - 1 & uVar48;
        } while (uVar48 != 0);
      }
    }
    uVar48 = uVar47 & 0xfffffffffffffff0;
    for (lVar43 = 0; lVar43 != (ulong)((uint)uVar47 & 0xf) - 8; lVar43 = lVar43 + 1) {
      lVar41 = lVar43 * 0xb0;
      pfVar1 = (float *)(uVar48 + 0x80 + lVar41);
      fVar67 = *pfVar1;
      fVar71 = pfVar1[1];
      fVar75 = pfVar1[2];
      fVar88 = pfVar1[3];
      pfVar1 = (float *)(uVar48 + 0x40 + lVar41);
      fVar92 = *pfVar1;
      fVar21 = pfVar1[1];
      fVar22 = pfVar1[2];
      fVar23 = pfVar1[3];
      pfVar1 = (float *)(uVar48 + 0x70 + lVar41);
      fVar95 = *pfVar1;
      fVar98 = pfVar1[1];
      fVar101 = pfVar1[2];
      fVar103 = pfVar1[3];
      pfVar1 = (float *)(uVar48 + 0x50 + lVar41);
      fVar24 = *pfVar1;
      fVar25 = pfVar1[1];
      fVar26 = pfVar1[2];
      fVar27 = pfVar1[3];
      fVar93 = fVar95 * fVar24 - fVar67 * fVar92;
      fVar96 = fVar98 * fVar25 - fVar71 * fVar21;
      fVar99 = fVar101 * fVar26 - fVar75 * fVar22;
      fVar102 = fVar103 * fVar27 - fVar88 * fVar23;
      pfVar1 = (float *)(uVar48 + 0x60 + lVar41);
      fVar28 = *pfVar1;
      fVar29 = pfVar1[1];
      fVar30 = pfVar1[2];
      fVar31 = pfVar1[3];
      pfVar1 = (float *)(uVar48 + lVar41);
      puVar2 = (undefined8 *)(uVar48 + 0x10 + lVar41);
      uVar36 = *puVar2;
      uVar37 = puVar2[1];
      pfVar3 = (float *)(uVar48 + 0x20 + lVar41);
      pfVar4 = (float *)(uVar48 + 0x30 + lVar41);
      fVar32 = *pfVar4;
      fVar33 = pfVar4[1];
      fVar34 = pfVar4[2];
      fVar35 = pfVar4[3];
      fVar104 = fVar67 * fVar32 - fVar24 * fVar28;
      fVar105 = fVar71 * fVar33 - fVar25 * fVar29;
      fVar106 = fVar75 * fVar34 - fVar26 * fVar30;
      fVar107 = fVar88 * fVar35 - fVar27 * fVar31;
      fVar55 = *(float *)(ray + k * 4);
      fVar57 = *(float *)(ray + k * 4 + 0x20);
      fVar59 = *(float *)(ray + k * 4 + 0x40);
      fVar108 = *pfVar1 - fVar55;
      fVar109 = pfVar1[1] - fVar55;
      fVar110 = pfVar1[2] - fVar55;
      fVar55 = pfVar1[3] - fVar55;
      fVar94 = *pfVar3 - fVar57;
      fVar97 = pfVar3[1] - fVar57;
      fVar100 = pfVar3[2] - fVar57;
      fVar57 = pfVar3[3] - fVar57;
      fVar61 = *(float *)(ray + k * 4 + 0x60);
      fVar80 = fVar59 * fVar94 - fVar108 * fVar61;
      fVar83 = fVar59 * fVar97 - fVar109 * fVar61;
      fVar86 = fVar59 * fVar100 - fVar110 * fVar61;
      fVar90 = fVar59 * fVar57 - fVar55 * fVar61;
      fVar51 = fVar92 * fVar28 - fVar95 * fVar32;
      fVar52 = fVar21 * fVar29 - fVar98 * fVar33;
      fVar53 = fVar22 * fVar30 - fVar101 * fVar34;
      fVar54 = fVar23 * fVar31 - fVar103 * fVar35;
      fVar63 = *(float *)(ray + k * 4 + 0x10);
      local_898 = (float)uVar36;
      fStack_894 = (float)((ulong)uVar36 >> 0x20);
      fStack_890 = (float)uVar37;
      fStack_88c = (float)((ulong)uVar37 >> 0x20);
      local_898 = local_898 - fVar63;
      fStack_894 = fStack_894 - fVar63;
      fStack_890 = fStack_890 - fVar63;
      fStack_88c = fStack_88c - fVar63;
      fVar63 = *(float *)(ray + k * 4 + 0x50);
      fVar81 = fVar61 * local_898 - fVar63 * fVar94;
      fVar84 = fVar61 * fStack_894 - fVar63 * fVar97;
      fVar87 = fVar61 * fStack_890 - fVar63 * fVar100;
      fVar91 = fVar61 * fStack_88c - fVar63 * fVar57;
      fVar66 = fVar63 * fVar108 - fVar59 * local_898;
      fVar70 = fVar63 * fVar109 - fVar59 * fStack_894;
      fVar74 = fVar63 * fVar110 - fVar59 * fStack_890;
      fVar78 = fVar63 * fVar55 - fVar59 * fStack_88c;
      fVar111 = fVar61 * fVar51 + fVar104 * fVar63 + fVar93 * fVar59;
      fVar112 = fVar61 * fVar52 + fVar105 * fVar63 + fVar96 * fVar59;
      fVar113 = fVar61 * fVar53 + fVar106 * fVar63 + fVar99 * fVar59;
      fVar114 = fVar61 * fVar54 + fVar107 * fVar63 + fVar102 * fVar59;
      uVar56 = (uint)fVar111 & 0x80000000;
      uVar58 = (uint)fVar112 & 0x80000000;
      uVar60 = (uint)fVar113 & 0x80000000;
      uVar62 = (uint)fVar114 & 0x80000000;
      fVar95 = (float)((uint)(fVar28 * fVar81 + fVar95 * fVar80 + fVar67 * fVar66) ^ uVar56);
      fVar98 = (float)((uint)(fVar29 * fVar84 + fVar98 * fVar83 + fVar71 * fVar70) ^ uVar58);
      fVar101 = (float)((uint)(fVar30 * fVar87 + fVar101 * fVar86 + fVar75 * fVar74) ^ uVar60);
      fVar103 = (float)((uint)(fVar31 * fVar91 + fVar103 * fVar90 + fVar88 * fVar78) ^ uVar62);
      fVar71 = (float)((uint)(fVar81 * fVar32 + fVar80 * fVar92 + fVar66 * fVar24) ^ uVar56);
      fVar75 = (float)((uint)(fVar84 * fVar33 + fVar83 * fVar21 + fVar70 * fVar25) ^ uVar58);
      fVar88 = (float)((uint)(fVar87 * fVar34 + fVar86 * fVar22 + fVar74 * fVar26) ^ uVar60);
      fVar92 = (float)((uint)(fVar91 * fVar35 + fVar90 * fVar23 + fVar78 * fVar27) ^ uVar62);
      fVar59 = ABS(fVar111);
      fVar61 = ABS(fVar112);
      fVar63 = ABS(fVar113);
      fVar67 = ABS(fVar114);
      bVar17 = ((0.0 <= fVar71 && 0.0 <= fVar95) && fVar111 != 0.0) && fVar95 + fVar71 <= fVar59;
      bVar18 = ((0.0 <= fVar75 && 0.0 <= fVar98) && fVar112 != 0.0) && fVar98 + fVar75 <= fVar61;
      bVar19 = ((0.0 <= fVar88 && 0.0 <= fVar101) && fVar113 != 0.0) && fVar101 + fVar88 <= fVar63;
      bVar20 = ((0.0 <= fVar92 && 0.0 <= fVar103) && fVar114 != 0.0) && fVar103 + fVar92 <= fVar67;
      auVar16._4_4_ = -(uint)bVar18;
      auVar16._0_4_ = -(uint)bVar17;
      auVar16._8_4_ = -(uint)bVar19;
      auVar16._12_4_ = -(uint)bVar20;
      unaff_R14D = movmskps(unaff_R14D,auVar16);
      if (unaff_R14D != 0) {
        fVar71 = (float)(uVar56 ^ (uint)(fVar93 * fVar108 + fVar104 * local_898 + fVar51 * fVar94));
        fVar75 = (float)(uVar58 ^ (uint)(fVar96 * fVar109 + fVar105 * fStack_894 + fVar52 * fVar97))
        ;
        fVar88 = (float)(uVar60 ^ (uint)(fVar99 * fVar110 + fVar106 * fStack_890 + fVar53 * fVar100)
                        );
        fVar92 = (float)(uVar62 ^ (uint)(fVar102 * fVar55 + fVar107 * fStack_88c + fVar54 * fVar57))
        ;
        fVar55 = *(float *)(ray + k * 4 + 0x30);
        fVar57 = *(float *)(ray + k * 4 + 0x80);
        auVar15._4_4_ = -(uint)((fVar75 <= fVar57 * fVar61 && fVar55 * fVar61 < fVar75) && bVar18);
        auVar15._0_4_ = -(uint)((fVar71 <= fVar57 * fVar59 && fVar55 * fVar59 < fVar71) && bVar17);
        auVar15._8_4_ = -(uint)((fVar88 <= fVar57 * fVar63 && fVar55 * fVar63 < fVar88) && bVar19);
        auVar15._12_4_ = -(uint)((fVar92 <= fVar57 * fVar67 && fVar55 * fVar67 < fVar92) && bVar20);
        unaff_R14D = movmskps(unaff_R14D,auVar15);
        if (unaff_R14D != 0) {
          local_8a8 = (byte)unaff_R14D;
          uVar50 = (ulong)local_8a8;
          do {
            uVar13 = 0;
            if (uVar50 != 0) {
              for (; (uVar50 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
              }
            }
            if ((((context->scene->geometries).items[*(uint *)(lVar41 + uVar48 + 0x90 + uVar13 * 4)]
                 .ptr)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
              goto LAB_006e9e63;
            }
            uVar50 = uVar50 ^ 1L << (uVar13 & 0x3f);
          } while (uVar50 != 0);
          unaff_R14D = 0;
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }